

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Token * __thiscall toml::internal::Lexer::nextKey(Lexer *this)

{
  int iVar1;
  ulong uVar2;
  undefined8 in_RSI;
  Token *in_RDI;
  char c;
  string s;
  undefined5 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  Token *v;
  TokenType type;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string local_68 [55];
  char local_31;
  string local_30 [48];
  
  v = in_RDI;
  std::__cxx11::string::string(local_30);
  while( true ) {
    in_stack_ffffffffffffff77 =
         current((Lexer *)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffff77,
                                  CONCAT16(in_stack_ffffffffffffff76,
                                           CONCAT15(in_stack_ffffffffffffff75,
                                                    in_stack_ffffffffffffff70))));
    in_stack_ffffffffffffff76 = false;
    if ((bool)in_stack_ffffffffffffff77) {
      iVar1 = isalnum((int)local_31);
      in_stack_ffffffffffffff75 = true;
      in_stack_ffffffffffffff76 = in_stack_ffffffffffffff75;
      if ((iVar1 == 0) &&
         (in_stack_ffffffffffffff75 = true, in_stack_ffffffffffffff76 = in_stack_ffffffffffffff75,
         local_31 != '_')) {
        in_stack_ffffffffffffff75 = local_31 == '-';
        in_stack_ffffffffffffff76 = in_stack_ffffffffffffff75;
      }
    }
    type = (TokenType)((ulong)in_RSI >> 0x20);
    if ((bool)in_stack_ffffffffffffff76 == false) break;
    std::__cxx11::string::operator+=(local_30,local_31);
    next((Lexer *)CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,in_stack_ffffffffffffff70))))
    ;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),type,
                 (string *)v);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Unknown key format",(allocator *)&stack0xffffffffffffff97);
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),type,
                 (string *)v);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  std::__cxx11::string::~string(local_30);
  return v;
}

Assistant:

inline Token Lexer::nextKey()
{
    std::string s;
    char c;
    while (current(&c) && (isalnum(c) || c == '_' || c == '-')) {
        s += c;
        next();
    }

    if (s.empty())
        return Token(TokenType::ERROR_TOKEN, std::string("Unknown key format"));

    return Token(TokenType::IDENT, s);
}